

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O1

void cmdline_parser_print_help(void)

{
  char **ppcVar1;
  char *__s;
  
  cmdline_parser_print_version();
  if (*gengetopt_args_info_purpose != '\0') {
    printf("\n%s\n");
  }
  if (*gengetopt_args_info_usage != '\0') {
    printf("\n%s\n");
  }
  putchar(10);
  if (*gengetopt_args_info_description != '\0') {
    printf("%s\n\n");
  }
  if (gengetopt_args_info_help[0] != (char *)0x0) {
    ppcVar1 = gengetopt_args_info_help;
    __s = gengetopt_args_info_help[0];
    do {
      ppcVar1 = ppcVar1 + 1;
      puts(__s);
      __s = *ppcVar1;
    } while (__s != (char *)0x0);
  }
  return;
}

Assistant:

static void print_help_common(void) {
  cmdline_parser_print_version ();

  if (strlen(gengetopt_args_info_purpose) > 0)
    printf("\n%s\n", gengetopt_args_info_purpose);

  if (strlen(gengetopt_args_info_usage) > 0)
    printf("\n%s\n", gengetopt_args_info_usage);

  printf("\n");

  if (strlen(gengetopt_args_info_description) > 0)
    printf("%s\n\n", gengetopt_args_info_description);
}